

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_tree_clusterizer.h
# Opt level: O3

void crnlib::split_vectors<crnlib::vec<1u,float>>
               (vec<1U,_float> (*vectors) [64],uint (*weights) [64],uint size,
               vec<1U,_float> (*result) [2])

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [12];
  ulong uVar3;
  uint i;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  double dVar9;
  undefined1 auVar10 [16];
  float fVar11;
  float fVar12;
  double dVar13;
  float fVar14;
  float fVar15;
  float in_XMM5_Da;
  float fVar16;
  float in_XMM5_Db;
  undefined4 uVar17;
  undefined4 uVar18;
  float fVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  float fVar22;
  double weightedDotProducts [64];
  float afStack_308 [64];
  double adStack_208 [64];
  
  uVar3 = (ulong)size;
  if (size == 0) {
    dVar9 = 0.0;
    fVar15 = 0.0;
    fVar12 = 0.0;
  }
  else {
    fVar15 = 0.0;
    dVar9 = 0.0;
    uVar6 = 0;
    uVar5 = 0;
    do {
      uVar8 = (*weights)[uVar6];
      fVar11 = (float)uVar8;
      fVar12 = (*vectors)[uVar6].m_s[0];
      fVar14 = fVar12 * fVar11;
      afStack_308[uVar6] = fVar14;
      fVar15 = fVar15 + fVar14;
      uVar5 = uVar5 + uVar8;
      dVar13 = (double)(fVar12 * fVar12 * fVar11);
      adStack_208[uVar6] = dVar13;
      dVar9 = dVar9 + dVar13;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
    if ((long)uVar5 < 0) {
      fVar12 = (float)uVar5;
    }
    else {
      fVar12 = (float)(long)uVar5;
    }
  }
  fVar11 = 1.0;
  fVar12 = 1.0 / fVar12;
  fVar14 = fVar15 * fVar12;
  (*result)[1].m_s[0] = fVar14;
  (*result)[0].m_s[0] = fVar14;
  if (size == 1) {
    return;
  }
  dVar9 = dVar9 - (double)(fVar15 * fVar15 * fVar12);
  fVar19 = (float)((ulong)dVar9 >> 0x20);
  fVar15 = (float)dVar9;
  if (fVar15 <= 0.0) {
    return;
  }
  if (size != 0) {
    dVar9 = -1.0;
    uVar5 = 0;
    do {
      fVar15 = (*vectors)[uVar5].m_s[0];
      fVar19 = fVar15 - fVar14;
      auVar10._0_8_ = (double)(fVar19 * fVar19);
      auVar10._8_8_ = 0;
      fVar19 = 0.0;
      if (auVar10._0_8_ <= dVar9) {
        fVar15 = in_XMM5_Da;
        fVar19 = in_XMM5_Db;
      }
      if (dVar9 <= auVar10._0_8_) {
        dVar9 = auVar10._0_8_;
      }
      uVar5 = uVar5 + 1;
      in_XMM5_Da = fVar15;
      in_XMM5_Db = fVar19;
    } while (uVar3 != uVar5);
    if (size != 0) {
      fVar19 = -1.0;
      uVar5 = 0;
      do {
        fVar22 = (*vectors)[uVar5].m_s[0];
        uVar6 = (ulong)(uint)fVar22;
        uVar17 = 0;
        fVar22 = fVar22 - fVar15;
        fVar22 = fVar22 * fVar22;
        uVar18 = 0;
        if (fVar22 <= fVar19) {
          uVar6 = auVar10._0_8_;
          uVar17 = auVar10._8_4_;
          uVar18 = auVar10._12_4_;
        }
        if (fVar19 <= fVar22) {
          fVar19 = fVar22;
        }
        uVar5 = uVar5 + 1;
        auVar10._8_4_ = uVar17;
        auVar10._0_8_ = (double)uVar6;
        auVar10._12_4_ = uVar18;
      } while (uVar3 != uVar5);
      fVar15 = (fVar15 + fVar14) * 0.5;
      fVar19 = ((float)uVar6 + fVar14) * 0.5;
      if (2 < size) {
        fVar22 = 0.0;
        uVar5 = 0;
        do {
          fVar16 = (*vectors)[uVar5].m_s[0] - fVar14;
          fVar22 = fVar22 + fVar16 * fVar16 * (float)(*weights)[uVar5];
          uVar5 = uVar5 + 1;
        } while (uVar3 != uVar5);
        iVar4 = 10;
        do {
          fVar11 = fVar11 * fVar22 * fVar12;
          uVar8 = -(uint)(fVar11 != 0.0);
          fVar11 = (float)(uVar8 & 0x3f800000 | ~uVar8 & (uint)fVar11);
          iVar4 = iVar4 + -1;
        } while (iVar4 != 0);
        uVar8 = -(uint)(fVar11 * fVar11 != 0.0);
        dVar9 = 0.0;
        dVar13 = 0.0;
        uVar5 = 0;
        auVar20 = ZEXT816(0);
        fVar12 = 0.0;
        do {
          fVar22 = auVar20._0_4_;
          if (0.0 <= ((*vectors)[uVar5].m_s[0] - fVar14) *
                     (float)(~uVar8 & 0x3f800000 | (uint)(1.0 / SQRT(fVar11 * fVar11)) & uVar8) *
                     fVar11) {
            fVar22 = afStack_308[uVar5] + fVar22;
            auVar2._4_8_ = auVar20._8_8_;
            auVar2._0_4_ = (int)((ulong)dVar9 >> 0x20);
            auVar21._0_8_ = auVar2._0_8_ << 0x20;
            auVar21._8_4_ = SUB84(dVar13,0);
            auVar21._12_4_ = (int)((ulong)dVar13 >> 0x20);
            dVar13 = auVar21._8_8_ + (double)(*weights)[uVar5];
          }
          else {
            fVar12 = afStack_308[uVar5] + fVar12;
            dVar9 = dVar9 + (double)(*weights)[uVar5];
          }
          uVar5 = uVar5 + 1;
          auVar20._4_4_ = fVar22;
          auVar20._0_4_ = fVar22;
          auVar20._8_4_ = fVar22;
          auVar20._12_4_ = fVar22;
        } while (uVar3 != uVar5);
        if ((0.0 < dVar9) && (0.0 < dVar13)) {
          auVar1._8_4_ = SUB84(dVar13,0);
          auVar1._0_8_ = dVar9;
          auVar1._12_4_ = (int)((ulong)dVar13 >> 0x20);
          auVar10 = divpd(_DAT_001a6410,auVar1);
          fVar15 = fVar12 * (float)auVar10._0_8_;
          fVar19 = fVar22 * (float)auVar10._8_8_;
        }
      }
      goto LAB_001792d7;
    }
  }
  fVar15 = (fVar15 + fVar14) * 0.5;
LAB_001792d7:
  iVar4 = 0;
  fVar12 = 1e+10;
  do {
    if (size == 0) {
      return;
    }
    fVar11 = 0.0;
    dVar13 = 0.0;
    uVar7 = 0;
    dVar9 = 0.0;
    uVar5 = 0;
    uVar6 = 0;
    fVar14 = 0.0;
    do {
      fVar22 = (*vectors)[uVar7].m_s[0];
      fVar16 = fVar15 - fVar22;
      fVar22 = fVar19 - fVar22;
      if (fVar22 * fVar22 <= fVar16 * fVar16) {
        fVar11 = fVar11 + afStack_308[uVar7];
        dVar13 = dVar13 + adStack_208[uVar7];
        uVar5 = uVar5 + (*weights)[uVar7];
      }
      else {
        fVar14 = fVar14 + afStack_308[uVar7];
        dVar9 = dVar9 + adStack_208[uVar7];
        uVar6 = uVar6 + (*weights)[uVar7];
      }
      uVar7 = uVar7 + 1;
    } while (uVar3 != uVar7);
    if (uVar6 == 0) {
      return;
    }
    if (uVar5 == 0) {
      return;
    }
    fVar22 = (float)(dVar13 - (double)(fVar11 * fVar11 * (1.0 / (float)uVar5))) +
             (float)(dVar9 - (double)(fVar14 * fVar14 * (1.0 / (float)uVar6)));
    fVar15 = (1.0 / (float)uVar6) * fVar14;
    fVar19 = (1.0 / (float)uVar5) * fVar11;
  } while (((1e-05 <= fVar22) && (1e-05 <= (fVar12 - fVar22) / fVar22)) &&
          (iVar4 = iVar4 + 1, fVar12 = fVar22, iVar4 != 0x400));
  (*result)[0].m_s[0] = fVar15;
  (*result)[1].m_s[0] = fVar19;
  return;
}

Assistant:

void split_vectors(VectorType (&vectors)[64], uint (&weights)[64], uint size, VectorType (&result)[2]) {
  VectorType weightedVectors[64];
  double weightedDotProducts[64];
  VectorType centroid(cClear);
  uint64 total_weight = 0;
  double ttsum = 0.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    const uint weight = weights[i];
    weightedVectors[i] = v * (float)weight;
    centroid += weightedVectors[i];
    total_weight += weight;
    weightedDotProducts[i] = v.dot(v) * weight;
    ttsum += weightedDotProducts[i];
  }
  float variance = (float)(ttsum - (centroid.dot(centroid) / total_weight));
  centroid *= (1.0f / total_weight);
  result[0] = result[1] = centroid;
  if (variance <= 0.0f || size == 1)
    return;
  VectorType furthest;
  double furthest_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(centroid);
    if (dist > furthest_dist) {
      furthest_dist = dist;
      furthest = v;
    }
  }
  VectorType opposite;
  double opposite_dist = -1.0f;
  for (uint i = 0; i < size; i++) {
    const VectorType& v = vectors[i];
    double dist = v.squared_distance(furthest);
    if (dist > opposite_dist) {
      opposite_dist = dist;
      opposite = v;
    }
  }
  VectorType left_child((furthest + centroid) * .5f);
  VectorType right_child((opposite + centroid) * .5f);
  if (size > 2) {
    const uint N = VectorType::num_elements;
    matrix<N, N, float> covar;
    covar.clear();
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i] - centroid;
      const VectorType w = v * (float)weights[i];
      for (uint x = 0; x < N; x++) {
        for (uint y = x; y < N; y++)
          covar[x][y] = covar[x][y] + v[x] * w[y];
      }
    }
    float divider = (float)total_weight;
    for (uint x = 0; x < N; x++) {
      for (uint y = x; y < N; y++) {
        covar[x][y] /= divider;
        covar[y][x] = covar[x][y];
      }
    }
    VectorType axis(1.0f);
    for (uint iter = 0; iter < 10; iter++) {
      VectorType x;
      double max_sum = 0;
      for (uint i = 0; i < N; i++) {
        double sum = 0;
        for (uint j = 0; j < N; j++)
          sum += axis[j] * covar[i][j];
        x[i] = (float)sum;
        max_sum = i ? math::maximum(max_sum, sum) : sum;
      }
      if (max_sum != 0.0f)
        x *= (float)(1.0f / max_sum);
      axis = x;
    }
    axis.normalize();
    VectorType new_left_child(0.0f);
    VectorType new_right_child(0.0f);
    double left_weight = 0.0f;
    double right_weight = 0.0f;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      const float weight = (float)weights[i];
      double t = (v - centroid) * axis;
      if (t < 0.0f) {
        new_left_child += weightedVectors[i];
        left_weight += weight;
      } else {
        new_right_child += weightedVectors[i];
        right_weight += weight;
      }
    }
    if ((left_weight > 0.0f) && (right_weight > 0.0f)) {
      left_child = new_left_child * (float)(1.0f / left_weight);
      right_child = new_right_child * (float)(1.0f / right_weight);
    }
  }
  uint64 left_weight = 0;
  uint64 right_weight = 0;
  float prev_total_variance = 1e+10f;
  float left_variance = 0.0f;
  float right_variance = 0.0f;
  const uint cMaxLoops = 1024;
  for (uint total_loops = 0; total_loops < cMaxLoops; total_loops++) {
    VectorType new_left_child(cClear);
    VectorType new_right_child(cClear);
    double left_ttsum = 0.0f;
    double right_ttsum = 0.0f;
    left_weight = 0;
    right_weight = 0;
    for (uint i = 0; i < size; i++) {
      const VectorType& v = vectors[i];
      double left_dist2 = left_child.squared_distance(v);
      double right_dist2 = right_child.squared_distance(v);
      if (left_dist2 < right_dist2) {
        new_left_child += weightedVectors[i];
        left_ttsum += weightedDotProducts[i];
        left_weight += weights[i];
      } else {
        new_right_child += weightedVectors[i];
        right_ttsum += weightedDotProducts[i];
        right_weight += weights[i];
      }
    }
    if ((!left_weight) || (!right_weight))
      return;
    left_variance = (float)(left_ttsum - (new_left_child.dot(new_left_child) / left_weight));
    right_variance = (float)(right_ttsum - (new_right_child.dot(new_right_child) / right_weight));
    new_left_child *= (1.0f / left_weight);
    new_right_child *= (1.0f / right_weight);
    left_child = new_left_child;
    right_child = new_right_child;
    float total_variance = left_variance + right_variance;
    if (total_variance < .00001f)
      break;
    if (((prev_total_variance - total_variance) / total_variance) < .00001f)
      break;
    prev_total_variance = total_variance;
  }
  result[0] = left_child;
  result[1] = right_child;
}